

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linecontext.cpp
# Opt level: O2

int __thiscall LineContext::init(LineContext *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int in_EAX;
  long lVar2;
  initializer_list<QString> args;
  initializer_list<QString> args_00;
  QFileInfo info;
  QString ext;
  QStringList cpp;
  QStringList py;
  QString local_68;
  QString local_50;
  QString local_38;
  
  if (this->mInit == false) {
    this->mInit = true;
    QFileInfo::QFileInfo(&info,(QString *)ctx);
    QString::QString((QString *)&py,"cpp");
    QString::QString(&local_68,"cxx");
    QString::QString(&local_50,"h");
    QString::QString(&local_38,"hpp");
    args._M_len = 4;
    args._M_array = (iterator)&py;
    QList<QString>::QList(&cpp,args);
    lVar2 = 0x48;
    do {
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)((long)&py.d.d + lVar2));
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != -0x18);
    QString::QString(&ext,"py");
    args_00._M_len = 1;
    args_00._M_array = &ext;
    QList<QString>::QList(&py,args_00);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&ext.d);
    QFileInfo::suffix();
    bVar1 = QListSpecialMethods<QString>::contains
                      ((QListSpecialMethods<QString> *)&cpp,&ext,CaseSensitive);
    if (bVar1) {
      parseCpp(this,(QString *)ctx);
    }
    bVar1 = QListSpecialMethods<QString>::contains
                      ((QListSpecialMethods<QString> *)&py,&ext,CaseSensitive);
    if (bVar1) {
      parsePython(this,(QString *)ctx);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&ext.d);
    QArrayDataPointer<QString>::~QArrayDataPointer(&py.d);
    QArrayDataPointer<QString>::~QArrayDataPointer(&cpp.d);
    in_EAX = QFileInfo::~QFileInfo(&info);
  }
  return in_EAX;
}

Assistant:

void LineContext::init(const QString &path)
{
    if (mInit) {
        return;
    }
    mInit = true;

    QFileInfo info(path);

    QStringList cpp = {"cpp", "cxx", "h", "hpp"};
    QStringList py = {"py"};

    QString ext = info.suffix();

    if (cpp.contains(ext)) {
        parseCpp(path);
    }
    if (py.contains(ext)) {
        parsePython(path);
    }
}